

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteString
          (EpsCopyOutputStream *this,uint32_t num,Cord *s,uint8_t *ptr)

{
  byte *pbVar1;
  ulong uVar2;
  uint8_t *puVar3;
  uint8_t *extraout_RAX;
  uint uVar4;
  
  pbVar1 = this->end_;
  if (pbVar1 <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
    pbVar1 = this->end_;
  }
  if (pbVar1 <= ptr) {
    WriteString((EpsCopyOutputStream *)&stack0xffffffffffffffd8);
    return extraout_RAX;
  }
  uVar2 = (ulong)(num * 8 + 2);
  if (0x7f < num << 3) {
    do {
      uVar4 = (uint)uVar2;
      *ptr = (byte)uVar2 | 0x80;
      uVar2 = uVar2 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar4);
  }
  *ptr = (byte)uVar2;
  puVar3 = WriteCordOutline(this,s,ptr + 1);
  return puVar3;
}

Assistant:

uint8_t* WriteString(uint32_t num, const absl::Cord& s, uint8_t* ptr) {
    ptr = EnsureSpace(ptr);
    ptr = WriteTag(num, 2, ptr);
    return WriteCordOutline(s, ptr);
  }